

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  char *__s;
  ulong uVar6;
  CharFormat CVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *s_1;
  long in_FS_OFFSET;
  char cVar12;
  bool bVar13;
  bool bVar14;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  CVar7 = PrintCharsAsStringTo<char>((s->_M_dataplus)._M_p,s->_M_string_length,os);
  if ((CVar7 != kAsIs) && (FLAGS_gtest_print_utf8 == '\x01')) {
    __s = (s->_M_dataplus)._M_p;
    uVar6 = s->_M_string_length;
    bVar13 = uVar6 != 0;
    if (bVar13) {
      uVar11 = 1;
      do {
        bVar3 = __s[uVar11 - 1];
        iVar8 = iscntrl((uint)bVar3);
        if ((iVar8 != 0) && ((0xd < bVar3 || ((0x2600U >> (bVar3 & 0x1f) & 1) == 0)))) break;
        bVar13 = uVar11 < uVar6;
        bVar14 = uVar11 != uVar6;
        uVar11 = uVar11 + 1;
      } while (bVar14);
    }
    if (!bVar13) {
      bVar13 = uVar6 == 0;
      if (!bVar13) {
        uVar11 = 0;
        do {
          uVar1 = uVar11 + 1;
          bVar3 = __s[uVar11];
          cVar12 = '\x03';
          uVar10 = uVar1;
          if ((char)bVar3 < '\0') {
            if (bVar3 < 0xc2) goto LAB_001618c3;
            if (((0xdf < bVar3) || (uVar6 < uVar11 + 2)) ||
               (cVar12 = '\0', uVar10 = uVar11 + 2, -0x41 < __s[uVar1])) {
              if ((((bVar3 & 0xf0) == 0xe0) && (uVar10 = uVar11 + 3, uVar10 <= uVar6)) &&
                 ((bVar4 = __s[uVar1], (char)bVar4 < -0x40 && (__s[uVar11 + 2] < -0x40)))) {
                cVar12 = '\0';
                if (bVar3 == 0xed) {
                  if (0x9f < bVar4) goto LAB_0016185f;
                }
                else if ((bVar3 == 0xe0) && (bVar4 < 0xa0)) goto LAB_0016185f;
              }
              else {
LAB_0016185f:
                if (((byte)(bVar3 + 0x10) < 5) &&
                   ((((uVar2 = uVar11 + 4, uVar2 <= uVar6 &&
                      (bVar4 = __s[uVar1], (char)bVar4 < -0x40)) && (__s[uVar11 + 2] < -0x40)) &&
                    (__s[uVar11 + 3] < -0x40)))) {
                  uVar10 = uVar2;
                  if (bVar3 == 0xf4) {
                    cVar12 = 0x8f < bVar4;
                    uVar10 = uVar1;
                    if (!(bool)cVar12) {
                      uVar10 = uVar2;
                    }
                  }
                  else {
                    cVar12 = '\0';
                    if ((bVar3 == 0xf0) && (bVar4 < 0x90)) goto LAB_001618c3;
                  }
                }
                else {
LAB_001618c3:
                  cVar12 = '\x01';
                  uVar10 = uVar1;
                }
              }
            }
          }
        } while (((cVar12 == '\x03') || (cVar12 == '\0')) &&
                (bVar13 = uVar10 >= uVar6, uVar11 = uVar10, uVar10 < uVar6));
      }
      if (bVar13) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n    As Text: \"",0xf);
        if (__s == (char *)0x0) {
          std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar9 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar9);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
          return;
        }
        goto LAB_00161983;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
LAB_00161983:
  __stack_chk_fail();
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}